

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O1

Udata * luaS_newudata(lua_State *L,size_t s,int nuvalue)

{
  Udata *pUVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = 0x20;
  if (nuvalue != 0) {
    uVar2 = (long)nuvalue * 0x10 + 0x28;
  }
  if (s <= (uVar2 ^ 0x7fffffffffffffff)) {
    pUVar1 = (Udata *)luaC_newobj(L,7,uVar2 + s);
    pUVar1->len = s;
    pUVar1->nuvalue = (unsigned_short)nuvalue;
    pUVar1->metatable = (Table *)0x0;
    if (0 < nuvalue) {
      lVar3 = 0;
      do {
        *(undefined1 *)((long)pUVar1->uv + lVar3 + 8) = 0;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)nuvalue << 4 != lVar3);
    }
    return pUVar1;
  }
  luaM_toobig(L);
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, int nuvalue) {
  Udata *u;
  int i;
  GCObject *o;
  if (l_unlikely(s > MAX_SIZE - udatamemoffset(nuvalue)))
    luaM_toobig(L);
  o = luaC_newobj(L, LUA_VUSERDATA, sizeudata(nuvalue, s));
  u = gco2u(o);
  u->len = s;
  u->nuvalue = nuvalue;
  u->metatable = NULL;
  for (i = 0; i < nuvalue; i++)
    setnilvalue(&u->uv[i].uv);
  return u;
}